

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_ScopedLdInst<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  PropertyId propertyId;
  RootObjectBase *rootObject;
  FrameDisplay *pScope;
  Var value;
  FunctionBody *this_00;
  Var local_38;
  Var thisVar;
  
  local_38 = (Var)0x0;
  rootObject = FunctionBody::GetRootObject(*(FunctionBody **)(this + 0x88));
  this_00 = *(FunctionBody **)(this + 0x88);
  if ((~*(ushort *)&(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x1100)
      == 0) {
    pScope = GetLocalFrameDisplay(this);
    this_00 = *(FunctionBody **)(this + 0x88);
  }
  else {
    pScope = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  propertyId = FunctionBody::GetReferencedPropertyId(this_00,(uint)playout->PropertyIdIndex);
  value = JavascriptOperators::OP_GetInstanceScoped
                    (pScope,propertyId,rootObject,&local_38,*(ScriptContext **)(this + 0x78));
  SetReg<unsigned_short>(this,playout->Value,value);
  SetReg<unsigned_short>(this,playout->Value2,local_38);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ScopedLdInst(const unaligned T * playout)
    {
        Var thisVar = nullptr;
        Var rootObject = GetFunctionBody()->GetRootObject();
        Var result = JavascriptOperators::OP_GetInstanceScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), rootObject, &thisVar, GetScriptContext());
        SetReg(playout->Value, result);
        SetReg(playout->Value2, thisVar);
    }